

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeList.h
# Opt level: O1

CNodeType * __thiscall
Refal2::CNodeList<Refal2::CHole>::InsertBefore
          (CNodeList<Refal2::CHole> *this,CNodeType *nodeBefore,CHole *value)

{
  int iVar1;
  undefined4 extraout_var;
  CNode<Refal2::CHole> **ppCVar3;
  CNodeType *pCVar2;
  
  if (nodeBefore != (CNodeType *)0x0) {
    iVar1 = (*this->_vptr_CNodeList[3])(this,value);
    pCVar2 = (CNodeType *)CONCAT44(extraout_var,iVar1);
    pCVar2->next = nodeBefore;
    pCVar2->prev = nodeBefore->prev;
    if (this->first == nodeBefore) {
      ppCVar3 = &this->first;
    }
    else {
      ppCVar3 = &nodeBefore->prev->next;
    }
    *ppCVar3 = pCVar2;
    nodeBefore->prev = pCVar2;
    return pCVar2;
  }
  __assert_fail("nodeBefore != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/include/NodeList.h"
                ,0xb8,
                "typename CNodeList<T>::CNodeType *Refal2::CNodeList<Refal2::CHole>::InsertBefore(CNodeType *, const T &) [T = Refal2::CHole]"
               );
}

Assistant:

typename CNodeList<T>::CNodeType* CNodeList<T>::InsertBefore(
	CNodeType* nodeBefore, const T& value )
{
	assert( nodeBefore != nullptr );
	CNodeType* newNode = Alloc( value );
	newNode->next = nodeBefore;
	newNode->prev = nodeBefore->prev;
	if( nodeBefore == first ) {
		first = newNode;
	} else {
		nodeBefore->prev->next = newNode;
	}
	nodeBefore->prev = newNode;

	return newNode;
}